

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O2

shared_ptr<Camera> __thiscall
Camera::Create(Camera *this,shared_ptr<myvk::Device> *device,uint32_t frame_count)

{
  DescriptorSet *this_00;
  Camera *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long lVar3;
  ulong __n;
  shared_ptr<Camera> sVar4;
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  allocator_type local_81;
  Camera *local_80;
  _Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> local_78
  ;
  undefined1 local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_80 = this;
  std::make_shared<Camera>();
  local_40._M_ptr._0_4_ = 6;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_40;
  local_40._M_ptr._4_4_ = frame_count;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_78,__l,
             &local_81);
  myvk::DescriptorPool::Create
            ((DescriptorPool *)local_58,device,frame_count,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_78);
  std::__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)&local_80->m_position + 0x38),
             (__shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~_Vector_base
            ((_Vector_base<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)&local_78)
  ;
  local_58 = (undefined1  [8])0x600000000;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3000000001;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_58;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             &local_78,__l_00,(allocator_type *)&local_81);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)&local_40,device,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             &local_78);
  pCVar1 = local_80;
  std::__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)&local_80->m_position + 0x48),&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::_Vector_base<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
  ~_Vector_base(&local_78);
  lVar3 = *(long *)&pCVar1->m_position;
  __n = (ulong)frame_count;
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)local_58,__n,(value_type *)(lVar3 + 0x48),(allocator_type *)&local_40);
  myvk::DescriptorSet::CreateMultiple
            ((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
              *)&local_78,(Ptr<DescriptorPool> *)(lVar3 + 0x38),
             (vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
              *)local_58);
  pCVar1 = local_80;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::_M_move_assign((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                    *)(*(long *)&local_80->m_position + 0x70),
                   (__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)&local_78);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)local_58);
  std::vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>::
  resize((vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_> *)
         (*(long *)&pCVar1->m_position + 0x58),__n);
  _Var2._M_pi = extraout_RDX;
  for (lVar3 = 0; __n << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    myvk::Buffer::Create
              ((Buffer *)local_58,device,0x40,0x404,0x10,VMA_MEMORY_USAGE_AUTO,
               (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                *)&local_78);
    pCVar1 = local_80;
    std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)(*(long *)&local_80->m_position + 0x58) + lVar3),
               (__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
    std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
    ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            &local_78);
    this_00 = *(DescriptorSet **)(*(long *)(*(long *)&pCVar1->m_position + 0x70) + lVar3);
    std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
              ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)(*(long *)&pCVar1->m_position + 0x58) + lVar3));
    myvk::DescriptorSet::UpdateUniformBuffer
              (this_00,(Ptr<BufferBase> *)&local_78,0,0,0,0xffffffffffffffff);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_78._M_impl.super__Vector_impl_data._M_finish);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_80;
  return (shared_ptr<Camera>)sVar4.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Camera> Camera::Create(const std::shared_ptr<myvk::Device> &device, uint32_t frame_count) {
	std::shared_ptr<Camera> ret = std::make_shared<Camera>();
	ret->m_descriptor_pool =
	    myvk::DescriptorPool::Create(device, frame_count, {{VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, frame_count}});
	{
		VkDescriptorSetLayoutBinding camera_binding = {};
		camera_binding.binding = 0;
		camera_binding.descriptorType = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
		camera_binding.descriptorCount = 1;
		camera_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		ret->m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {camera_binding});
	}

	ret->m_descriptor_sets = myvk::DescriptorSet::CreateMultiple(
	    ret->m_descriptor_pool,
	    std::vector<std::shared_ptr<myvk::DescriptorSetLayout>>(frame_count, ret->m_descriptor_set_layout));
	ret->m_uniform_buffers.resize(frame_count);

	for (uint32_t i = 0; i < frame_count; ++i) {
		ret->m_uniform_buffers[i] = myvk::Buffer::Create(device, sizeof(UniformData),
		                                                 VMA_ALLOCATION_CREATE_MAPPED_BIT |
		                                                     VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT,
		                                                 VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
		ret->m_descriptor_sets[i]->UpdateUniformBuffer(ret->m_uniform_buffers[i], 0);
	}

	return ret;
}